

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::ES5ArrayTypeHandlerBase<int>::ES5ArrayTypeHandlerBase
          (ES5ArrayTypeHandlerBase<int> *this,Recycler *recycler)

{
  Recycler *alloc;
  IndexPropertyDescriptorMap *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  DictionaryTypeHandlerBase<int>::DictionaryTypeHandlerBase
            (&this->super_DictionaryTypeHandlerBase<int>,recycler);
  (this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler._vptr_DynamicTypeHandler =
       (_func_int **)&PTR_GetCppName_013d7940;
  (this->indexPropertyMap).ptr = (IndexPropertyDescriptorMap *)0x0;
  this->dataItemAttributes = '\a';
  this->lengthWritable = true;
  local_48 = (undefined1  [8])&IndexPropertyDescriptorMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9953769;
  data.filename._0_4_ = 0xdf;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
  this_00 = (IndexPropertyDescriptorMap *)new<Memory::Recycler>(0x20,alloc,0x37a1d4);
  IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(this_00,recycler);
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::WriteBarrierSet
            (&this->indexPropertyMap,this_00);
  return;
}

Assistant:

ES5ArrayTypeHandlerBase<T>::ES5ArrayTypeHandlerBase(Recycler* recycler)
        : DictionaryTypeHandlerBase<T>(recycler), dataItemAttributes(PropertyDynamicTypeDefaults), lengthWritable(true)
    {
        indexPropertyMap = RecyclerNew(recycler, IndexPropertyDescriptorMap, recycler);
    }